

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::Contribute_v2
          (TPZDohrSubstruct<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *v2)

{
  uint uVar1;
  int iVar2;
  pair<int,_int> *ppVar3;
  double dVar4;
  complex<double> *__y;
  complex<double> *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long row;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double dVar8;
  
  SolveSystemZi(this);
  uVar1 = (uint)(this->fGlobalEqs).fNElements;
  uVar6 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    ppVar3 = (this->fGlobalEqs).fStore;
    row = (long)ppVar3[uVar6].first;
    iVar2 = ppVar3[uVar6].second;
    pcVar5 = (this->fWeights).super_TPZVec<std::complex<double>_>.fStore;
    __y = TPZFMatrix<std::complex<double>_>::operator()(&this->fzi,row,0);
    std::operator*(pcVar5 + row,__y);
    pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(v2,(long)iVar2,0);
    dVar4 = *(double *)(pcVar5->_M_value + 8);
    dVar8 = extraout_XMM0_Qa + *(double *)pcVar5->_M_value;
    *(double *)pcVar5->_M_value = dVar8;
    *(double *)(pcVar5->_M_value + 8) = in_XMM1_Qa + dVar4;
    in_XMM1_Qa = dVar8;
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2(TPZFMatrix<TVar> &v2) {
	int i;
	SolveSystemZi();
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fzi(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		v2(ind.second,0) += fWeights[ind.first] * fzi(ind.first,0);
	}
}